

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xunit.h
# Opt level: O3

void __thiscall bandit::reporter::xunit::~xunit(xunit *this)

{
  (this->super_progress_base).super_interface._vptr_interface = (_func_int **)&PTR__xunit_0011d560;
  std::__cxx11::stringstream::~stringstream((stringstream *)&this->work_stm_);
  std::ios_base::~ios_base((ios_base *)&this->field_0xf0);
  (this->super_progress_base).super_interface._vptr_interface =
       (_func_int **)&PTR__progress_base_0011d4d8;
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&(this->super_progress_base).test_run_errors_.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&(this->super_progress_base).failures_.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&(this->super_progress_base).contexts_.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
  return;
}

Assistant:

xunit(std::ostream& stm, const detail::failure_formatter_t& formatter)
          : progress_base(formatter), stm_(stm) {}